

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemZDisassembler.c
# Opt level: O0

DecodeStatus
decodeBDRAddr64Disp12Operand(MCInst *Inst,uint64_t Field,uint64_t Address,void *Decoder)

{
  DecodeStatus DVar1;
  uint *unaff_retaddr;
  
  DVar1 = decodeBDRAddr12Operand((MCInst *)Address,(uint64_t)Decoder,unaff_retaddr);
  return DVar1;
}

Assistant:

static DecodeStatus decodeBDRAddr64Disp12Operand(MCInst *Inst, uint64_t Field,
		uint64_t Address, const void *Decoder)
{
	return decodeBDRAddr12Operand(Inst, Field, SystemZMC_GR64Regs);
}